

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O2

void test_comments_11(void)

{
  run("comment removal should preserve surrounding whitespace","12345 {{! Comment Block! }} 67890",
      "{}",(char *)0x0,"12345  67890");
  return;
}

Assistant:

static void
test_comments_11(void)
{
    run(
        "comment removal should preserve surrounding whitespace",
        "12345 {{! Comment Block! }} 67890",
        "{}",
        NULL,
        "12345  67890"
    );
}